

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::DOMElementImpl::isEqualNode(DOMElementImpl *this,DOMNode *arg)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  DOMNode *pDVar6;
  DOMNode *pDVar7;
  long *plVar8;
  long lVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined8 uVar12;
  DOMNode *n2_1;
  DOMNode *n2;
  DOMNode *n1;
  XMLSize_t i;
  XMLSize_t len;
  DOMNamedNodeMap *map2;
  DOMNamedNodeMap *map1;
  bool hasAttrs;
  DOMNode *arg_local;
  DOMElementImpl *this_local;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  uVar2 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0x1b])(this,arg);
  if ((uVar2 & 1) == 0) {
    bVar1 = DOMNodeImpl::isEqualNode(&this->fNode,arg);
    if (bVar1) {
      uVar2 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0x1a])();
      iVar3 = (*arg->_vptr_DOMNode[0x1a])();
      if (((byte)uVar2 & 1) == ((byte)iVar3 & 1)) {
        if ((uVar2 & 1) != 0) {
          iVar3 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[0xb])();
          plVar4 = (long *)CONCAT44(extraout_var,iVar3);
          iVar3 = (*arg->_vptr_DOMNode[0xb])();
          plVar5 = (long *)CONCAT44(extraout_var_00,iVar3);
          pDVar6 = (DOMNode *)(**(code **)(*plVar4 + 0x28))();
          pDVar7 = (DOMNode *)(**(code **)(*plVar5 + 0x28))();
          if (pDVar6 != pDVar7) {
            return false;
          }
          for (n1 = (DOMNode *)0x0; n1 < pDVar6; n1 = (DOMNode *)((long)&n1->_vptr_DOMNode + 1)) {
            plVar8 = (long *)(**(code **)(*plVar4 + 0x18))(plVar4,n1);
            lVar9 = (**(code **)(*plVar8 + 0xc0))();
            if (lVar9 == 0) {
              uVar10 = (**(code **)(*plVar8 + 0x10))();
              lVar9 = (**(code **)(*plVar5 + 0x20))(plVar5,uVar10);
              if ((lVar9 == 0) ||
                 (uVar11 = (**(code **)(*plVar8 + 0xe0))(plVar8,lVar9), (uVar11 & 1) == 0)) {
                return false;
              }
            }
            else {
              uVar10 = (**(code **)(*plVar8 + 0xb0))();
              uVar12 = (**(code **)(*plVar8 + 0xc0))();
              lVar9 = (**(code **)(*plVar5 + 0x38))(plVar5,uVar10,uVar12);
              if ((lVar9 == 0) ||
                 (uVar11 = (**(code **)(*plVar8 + 0xe0))(plVar8,lVar9), (uVar11 & 1) == 0)) {
                return false;
              }
            }
          }
        }
        this_local._7_1_ = DOMParentNode::isEqualNode(&this->fParent,arg);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DOMElementImpl::isEqualNode(const DOMNode* arg) const
{
    if (isSameNode(arg)) {
        return true;
    }

    if (!fNode.isEqualNode(arg)) {
        return false;
    }

    bool hasAttrs = hasAttributes();

    if (hasAttrs != arg->hasAttributes()) {
        return false;
    }

    if (hasAttrs) {
        DOMNamedNodeMap* map1 = getAttributes();
        DOMNamedNodeMap* map2 = arg->getAttributes();

        XMLSize_t len = map1->getLength();
        if (len != map2->getLength()) {
            return false;
        }
        for (XMLSize_t i = 0; i < len; i++) {
            DOMNode* n1 = map1->item(i);
            if (!n1->getLocalName()) { // DOM Level 1 Node
                DOMNode* n2 = map2->getNamedItem(n1->getNodeName());
                if (!n2 || !n1->isEqualNode(n2)) {
                    return false;
                }
            }
            else {
                DOMNode* n2 = map2->getNamedItemNS(n1->getNamespaceURI(),
                                              n1->getLocalName());
                if (!n2 || !n1->isEqualNode(n2)) {
                    return false;
                }
            }
        }
    }

    return fParent.isEqualNode(arg);
}